

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void basic_suite::fail_fals(void)

{
  char input [5];
  decoder_type decoder;
  value_type local_168 [8];
  undefined4 local_160;
  value local_15c;
  basic_decoder<char> local_158;
  
  local_158.input.tail = local_168 + 4;
  builtin_memcpy(local_168,"fals",5);
  local_158.input.head = local_168;
  memset(&local_158.current,0,0x120);
  local_158.current.code = uninitialized;
  local_158.current.view.head = (const_pointer)0x0;
  local_158.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
  local_15c = local_158.current.code;
  local_160 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x11d,"void basic_suite::fail_fals()",&local_15c,&local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[1]>
            ("decoder.literal()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x11e,"void basic_suite::fail_fals()",&local_158.current.view,"");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[5]>
            ("decoder.tail()","\"fals\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x11f,"void basic_suite::fail_fals()",&local_158,"fals");
  return;
}

Assistant:

void fail_fals()
{
    const char input[] = "fals";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "fals");
}